

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lddgraph.hxx
# Opt level: O2

bool __thiscall lddgraph::run(lddgraph *this)

{
  string *__rhs;
  string *__rhs_00;
  byte bVar1;
  char cVar2;
  bool bVar3;
  ostream *poVar4;
  string dispcmd;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  alreadyScanned;
  string dotcmd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  string local_240;
  ofstream gvstream;
  
  if (this->_quiet == true) {
    bVar1 = this->_verbose;
    if ((bool)bVar1 == true) {
      poVar4 = std::operator<<((ostream *)&std::cerr,
                               "Incompatible options -q and -V, please choose one.");
      std::endl<char,std::char_traits<char>>(poVar4);
      return false;
    }
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,"Generating graph");
    std::endl<char,std::char_traits<char>>(poVar4);
    bVar1 = this->_verbose;
  }
  if ((bVar1 & 1) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Writing file ");
    poVar4 = std::operator<<(poVar4,(string *)&this->_gvoutput);
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  std::ofstream::ofstream(&gvstream);
  std::ofstream::open((char *)&gvstream,(_Ios_Openmode)(this->_gvoutput)._M_dataplus._M_p);
  __rhs = &this->_gvoutput;
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    if (this->_quiet == false) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Error: Unable to open file ");
      poVar4 = std::operator<<(poVar4,(string *)__rhs);
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    bVar3 = false;
  }
  else {
    poVar4 = std::operator<<((ostream *)&gvstream,"digraph Dependencies {");
    std::endl<char,std::char_traits<char>>(poVar4);
    alreadyScanned.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    alreadyScanned.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    alreadyScanned.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&local_240,(string *)this);
    lddrecurse(this,&local_240,&alreadyScanned,&gvstream);
    std::__cxx11::string::~string((string *)&local_240);
    poVar4 = std::operator<<((ostream *)&gvstream,"}");
    std::endl<char,std::char_traits<char>>(poVar4);
    std::ostream::flush();
    std::ofstream::close();
    if ((this->_gvmode != true) || (bVar3 = true, this->_imgmode != false)) {
      if (this->_verbose == true) {
        poVar4 = std::operator<<((ostream *)&std::cout,"Writing file ");
        poVar4 = std::operator<<(poVar4,(string *)&this->_imgoutput);
        std::endl<char,std::char_traits<char>>(poVar4);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&dotcmd,"dot ",(allocator<char> *)&dispcmd);
      std::operator+(&local_2c0,"-T",&this->_imgformat);
      std::operator+(&local_2a0,&local_2c0," -o");
      __rhs_00 = &this->_imgoutput;
      std::operator+(&local_280,&local_2a0,__rhs_00);
      std::operator+(&local_260,&local_280," ");
      std::operator+(&dispcmd,&local_260,__rhs);
      std::__cxx11::string::append((string *)&dotcmd);
      std::__cxx11::string::~string((string *)&dispcmd);
      std::__cxx11::string::~string((string *)&local_260);
      std::__cxx11::string::~string((string *)&local_280);
      std::__cxx11::string::~string((string *)&local_2a0);
      std::__cxx11::string::~string((string *)&local_2c0);
      system(dotcmd._M_dataplus._M_p);
      if (this->_verbose == true) {
        poVar4 = std::operator<<((ostream *)&std::cout,"Deleting file ");
        poVar4 = std::operator<<(poVar4,(string *)__rhs);
        std::endl<char,std::char_traits<char>>(poVar4);
      }
      if ((this->_gvmode != false) || (bVar3 = removefile(this,__rhs), bVar3)) {
        bVar3 = true;
        if (this->_imgmode == false) {
          std::operator+(&dispcmd,"display ",__rhs_00);
          system(dispcmd._M_dataplus._M_p);
          if (this->_verbose == true) {
            poVar4 = std::operator<<((ostream *)&std::cout,"Deleting file ");
            poVar4 = std::operator<<(poVar4,(string *)__rhs_00);
            std::endl<char,std::char_traits<char>>(poVar4);
          }
          bVar3 = removefile(this,__rhs_00);
          std::__cxx11::string::~string((string *)&dispcmd);
        }
      }
      else {
        bVar3 = false;
      }
      std::__cxx11::string::~string((string *)&dotcmd);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&alreadyScanned);
  }
  std::ofstream::~ofstream(&gvstream);
  return bVar3;
}

Assistant:

bool run()
    {
      if (_quiet && _verbose)
      {
        cerr << "Incompatible options -q and -V, please choose one." << endl;
        return false;
      }

      if (!_quiet)
        cout << "Generating graph" << endl;
      if (_verbose)
        cout << "Writing file " << _gvoutput << endl;
      ofstream gvstream;
      gvstream.open(_gvoutput.c_str());
      if (!gvstream.is_open())
      {
        if (!_quiet)
          cerr << "Error: Unable to open file " << _gvoutput << endl;
        return false;
      }

      gvstream << "digraph Dependencies {" << endl;

      /* Invokes ldd recursively */
      vector<string> alreadyScanned;
      lddrecurse(_input, alreadyScanned, gvstream);

      gvstream << "}" << endl;
      gvstream.flush();
      gvstream.close();

      /* Graphviz mode */
      if (_gvmode && !_imgmode)
        return true;

      /* Image file generation */
      if (_verbose)
        cout << "Writing file " << _imgoutput << endl;
      string dotcmd = "dot ";
      dotcmd += "-T" + _imgformat + " -o" + _imgoutput + " " + _gvoutput;
      system(dotcmd.c_str());

      /* Graphviz file cleanup */
      if (_verbose)
        cout << "Deleting file " << _gvoutput << endl;
      if (!_gvmode && !removefile(_gvoutput))
        return false;

      /* Image mode */
      if (_imgmode)
        return true;

      /* Image file display */
      string dispcmd = "display " + _imgoutput;
      system(dispcmd.c_str());

      /* Image file cleanup */
      if (_verbose)
        cout << "Deleting file " << _imgoutput << endl;
      return removefile(_imgoutput);
    }